

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O2

void mk_server_loop_balancer(mk_server *server)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  mk_list *list;
  mk_event_loop *loop;
  int *piVar4;
  char *pcVar5;
  ssize_t sVar6;
  mk_sched_worker *sched;
  mk_list *__mptr;
  mk_list *pmVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  uint *unaff_R13;
  uint64_t val;
  undefined8 local_80;
  mk_event management_event;
  
  list = mk_server_listen_init(server);
  if (list == (mk_list *)0x0) {
    mk_print(0x1001,"Failed to initialize listen sockets.");
    return;
  }
  loop = mk_event_loop_create(0x100);
  pmVar7 = list;
  if (loop == (mk_event_loop *)0x0) {
    mk_print(0x1001,"Could not initialize event loop");
    exit(1);
  }
  while (pmVar7 = pmVar7->next, pmVar7 != list) {
    mk_event_add(loop,*(int *)&pmVar7[-2].prev,1,1,&pmVar7[-7].next);
  }
  management_event._priority_head.prev = (mk_list *)0x0;
  management_event._priority_head.next = (mk_list *)0x0;
  management_event._head.prev = (mk_list *)0x0;
  management_event._head.next = (mk_list *)0x0;
  management_event.data = (void *)0x0;
  management_event.handler = (_func_int_void_ptr *)0x0;
  management_event.fd = 0;
  management_event.type = 0;
  management_event.mask = 0;
  management_event.status = '\0';
  management_event._13_3_ = 0;
  management_event.priority = '\0';
  management_event._65_7_ = 0;
  mk_event_add(loop,server->lib_ch_manager[0],0,1,&management_event);
  bVar10 = false;
  do {
    if (bVar10) {
      mk_event_loop_destroy(loop);
      mk_server_listen_exit(list);
      return;
    }
    mk_event_wait(loop);
    pvVar2 = loop->data;
    iVar3 = loop->n_events;
    if (0 < iVar3) {
      unaff_R13 = *(uint **)(*(long *)((long)pvVar2 + 8) + 4);
    }
    lVar8 = 0x10;
    for (lVar9 = 0; bVar10 = lVar9 < iVar3, lVar9 < iVar3; lVar9 = lVar9 + 1) {
      if ((unaff_R13[2] & 1) == 0) {
        if ((unaff_R13[2] & 0x2018) != 0) {
          uVar1 = *unaff_R13;
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          mk_print(0x1001,"[server] Error on socket %d: %s",(ulong)uVar1,pcVar5);
        }
      }
      else if (server->lib_ch_manager[0] == *unaff_R13) {
        sVar6 = read(server->lib_ch_manager[0],&val,8);
        if (sVar6 == 0) {
          return;
        }
        if (val == 0xdddddddd) break;
      }
      else {
        sched = mk_sched_next_target(server);
        if (sched == (mk_sched_worker *)0x0) {
          mk_print(0x1002,"[server] Over capacity.");
        }
        else {
          mk_server_listen_handler(sched,unaff_R13,server);
          if (0 < sched->signal_channel_w) {
            local_80 = 0xeeffaacc;
            write(sched->signal_channel_w,&local_80,8);
          }
        }
      }
      iVar3 = loop->n_events;
      if ((int)lVar9 + 1 < iVar3) {
        unaff_R13 = *(uint **)(*(long *)((long)pvVar2 + 8) + lVar8);
      }
      else {
        unaff_R13 = (uint *)0x0;
      }
      lVar8 = lVar8 + 0xc;
    }
  } while( true );
}

Assistant:

void mk_server_loop_balancer(struct mk_server *server)
{
    size_t bytes;
    uint64_t val;
    int operation_flag;
    struct mk_list *head;
    struct mk_list *listeners;
    struct mk_server_listen *listener;
    struct mk_event *event;
    struct mk_event_loop *evl;
    struct mk_sched_worker *sched;
    struct mk_event management_event;

    /* Init the listeners */
    listeners = mk_server_listen_init(server);
    if (!listeners) {
        mk_err("Failed to initialize listen sockets.");
        return;
    }

    /* Create an event loop context */
    evl = mk_event_loop_create(MK_EVENT_QUEUE_SIZE);
    if (!evl) {
        mk_err("Could not initialize event loop");
        exit(EXIT_FAILURE);
    }

    /* Register the listeners */
    mk_list_foreach(head, listeners) {
        listener = mk_list_entry(head, struct mk_server_listen, _head);
        mk_event_add(evl, listener->server_fd,
                     MK_EVENT_LISTENER, MK_EVENT_READ,
                     listener);
    }

    memset(&management_event, 0, sizeof(struct mk_event));

    mk_event_add(evl,
                 server->lib_ch_manager[0],
                 MK_EVENT_NOTIFICATION,
                 MK_EVENT_READ,
                 &management_event);

    operation_flag = MK_TRUE;
    while (operation_flag) {
        mk_event_wait(evl);
        mk_event_foreach(event, evl) {
            if (event->mask & MK_EVENT_READ) {
                /* This signal is sent by mk_stop and both this and
                 * mk_lib_worker are expecting it.
                 */
                if (server->lib_ch_manager[0] == event->fd) {
#ifdef _WIN32
        bytes = recv(event->fd, &val, sizeof(uint64_t), MSG_WAITALL);
#else
        bytes = read(event->fd, &val, sizeof(uint64_t));
#endif

                    if (bytes <= 0) {
                        return;
                    }

                    if (val == MK_SERVER_SIGNAL_STOP) {
                        operation_flag = MK_FALSE;

                        break;
                    }

                    continue;
                }

                /*
                 * Accept connection: determinate which thread may work on this
                 * new connection.
                 */
                sched = mk_sched_next_target(server);
                if (sched != NULL) {
                    mk_server_listen_handler(sched, event, server);

                    mk_server_lib_notify_event_loop_break(sched);

#ifdef MK_HAVE_TRACE
                    int i;
                    struct mk_sched_ctx *ctx = server->sched_ctx;

                    for (i = 0; i < server->workers; i++) {
                        MK_TRACE("Worker Status");
                        MK_TRACE(" WID %i / conx = %llu",
                                 ctx->workers[i].idx,
                                 ctx->workers[i].accepted_connections -
                                 ctx->workers[i].closed_connections);
                    }
#endif
                }
                else {
                    mk_warn("[server] Over capacity.");
                }
            }
            else if (event->mask & MK_EVENT_CLOSE) {
                mk_err("[server] Error on socket %d: %s",
                       event->fd, strerror(errno));
            }
        }
    }
    mk_event_loop_destroy(evl);
    mk_server_listen_exit(listeners);
}